

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O0

void decaf_448_point_add(decaf_448_point_s *p,decaf_448_point_s *q,decaf_448_point_s *r)

{
  word_t wVar1;
  word_t wVar2;
  gf_448_s *in_RDX;
  gf_448_s *in_RSI;
  gf_448_s *in_RDI;
  gf_448_t d;
  gf_448_t c;
  gf_448_t b;
  gf_448_t a;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  gf_448_s *in_stack_fffffffffffffe00;
  gf_448_s *in_stack_fffffffffffffe08;
  gf_448_s local_1c0;
  gf_448_s local_180;
  gf_448_s local_140;
  gf_448_s *local_e8;
  gf_448_s *local_e0;
  gf_448_s *local_d8;
  uint local_cc;
  gf_448_s *local_c8;
  gf_448_s *local_c0;
  gf_448_s *local_b8;
  uint local_ac;
  gf_448_s *local_a8;
  gf_448_s *local_a0;
  gf_448_s *local_98;
  uint local_8c;
  gf_448_s *local_88;
  gf_448_s *local_80;
  gf_448_s *in_stack_ffffffffffffff88;
  gf_448_s *bs;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar3;
  gf_448_s *in_stack_ffffffffffffff98;
  uint local_4c;
  
  local_e8 = in_RDX;
  local_e0 = in_RSI;
  local_d8 = in_RDI;
  gf_sub_nr(&local_180,in_RSI + 1,in_RSI);
  gf_sub_nr(&local_1c0,local_e8 + 1,local_e8);
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    wVar1 = (local_e8[1].limb + (ulong)local_4c * 2)[1];
    wVar2 = (local_e8->limb + (ulong)local_4c * 2)[1];
    *(word_t *)(&stack0xfffffffffffffe00 + (ulong)local_4c * 0x10) =
         local_e8[1].limb[(ulong)local_4c * 2] + local_e8->limb[(ulong)local_4c * 2];
    *(word_t *)(&stack0xfffffffffffffe08 + (ulong)local_4c * 0x10) = wVar1 + wVar2;
  }
  gf_448_mul(in_stack_ffffffffffffff98,
             (gf_448_s *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  for (uVar3 = 0; uVar3 < 4; uVar3 = uVar3 + 1) {
    wVar1 = (local_e0[1].limb + (ulong)uVar3 * 2)[1];
    wVar2 = (local_e0->limb + (ulong)uVar3 * 2)[1];
    local_180.limb[(ulong)uVar3 * 2] =
         local_e0[1].limb[(ulong)uVar3 * 2] + local_e0->limb[(ulong)uVar3 * 2];
    local_180.limb[(ulong)uVar3 * 2 + 1] = wVar1 + wVar2;
  }
  gf_448_mul(local_e0,(gf_448_s *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  gf_448_mul(local_e0,(gf_448_s *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  gf_mulw(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,0);
  bs = &local_180;
  local_80 = &local_140;
  local_88 = local_d8 + 1;
  for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
    wVar1 = local_140.limb[(ulong)local_8c * 2 + 1];
    wVar2 = (local_88->limb + (ulong)local_8c * 2)[1];
    bs->limb[(ulong)local_8c * 2] =
         local_80->limb[(ulong)local_8c * 2] + local_88->limb[(ulong)local_8c * 2];
    local_180.limb[(ulong)local_8c * 2 + 1] = wVar1 + wVar2;
  }
  gf_sub_nr(&local_1c0,local_d8 + 1,&local_140);
  gf_448_mul(local_e0,(gf_448_s *)CONCAT44(uVar3,in_stack_ffffffffffffff90),bs);
  local_98 = &local_140;
  local_a0 = &local_140;
  local_a8 = &local_140;
  for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
    wVar1 = local_140.limb[(ulong)local_ac * 2 + 1];
    wVar2 = local_140.limb[(ulong)local_ac * 2 + 1];
    local_98->limb[(ulong)local_ac * 2] =
         local_a0->limb[(ulong)local_ac * 2] + local_a8->limb[(ulong)local_ac * 2];
    local_140.limb[(ulong)local_ac * 2 + 1] = wVar1 + wVar2;
  }
  local_b8 = local_d8 + 1;
  local_c0 = &local_140;
  local_c8 = local_d8;
  for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
    wVar1 = local_140.limb[(ulong)local_cc * 2 + 1];
    wVar2 = (local_d8->limb + (ulong)local_cc * 2)[1];
    local_b8->limb[(ulong)local_cc * 2] =
         local_c0->limb[(ulong)local_cc * 2] + local_d8->limb[(ulong)local_cc * 2];
    (local_b8->limb + (ulong)local_cc * 2)[1] = wVar1 + wVar2;
  }
  gf_sub_nr(&local_140,&local_140,local_d8);
  gf_448_mul(local_e0,(gf_448_s *)CONCAT44(uVar3,in_stack_ffffffffffffff90),bs);
  gf_448_mul(local_e0,(gf_448_s *)CONCAT44(uVar3,in_stack_ffffffffffffff90),bs);
  gf_448_mul(local_e0,(gf_448_s *)CONCAT44(uVar3,in_stack_ffffffffffffff90),bs);
  gf_448_mul(local_e0,(gf_448_s *)CONCAT44(uVar3,in_stack_ffffffffffffff90),bs);
  return;
}

Assistant:

void API_NS(point_add) (
    point_t p,
    const point_t q,
    const point_t r
) {
    gf a, b, c, d;
    gf_sub_nr ( b, q->y, q->x ); /* 3+e */
    gf_sub_nr ( c, r->y, r->x ); /* 3+e */
    gf_add_nr ( d, r->y, r->x ); /* 2+e */
    gf_mul ( a, c, b );
    gf_add_nr ( b, q->y, q->x ); /* 2+e */
    gf_mul ( p->y, d, b );
    gf_mul ( b, r->t, q->t );
    gf_mulw ( p->x, b, 2*EFF_D );
    gf_add_nr ( b, a, p->y );    /* 2+e */
    gf_sub_nr ( c, p->y, a );    /* 3+e */
    gf_mul ( a, q->z, r->z );
    gf_add_nr ( a, a, a );       /* 2+e */
    if (GF_HEADROOM <= 3) gf_weak_reduce(a); /* or 1+e */
#if NEG_D
    gf_add_nr ( p->y, a, p->x ); /* 3+e or 2+e */
    gf_sub_nr ( a, a, p->x );    /* 4+e or 3+e */
#else
    gf_sub_nr ( p->y, a, p->x ); /* 4+e or 3+e */
    gf_add_nr ( a, a, p->x );    /* 3+e or 2+e */
#endif
    gf_mul ( p->z, a, p->y );
    gf_mul ( p->x, p->y, c );
    gf_mul ( p->y, a, b );
    gf_mul ( p->t, b, c );
}